

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O2

Node * wasm::DataFlow::Node::makeExpr(Expression *expr,Expression *origin)

{
  Node *pNVar1;
  
  pNVar1 = (Node *)operator_new(0x30);
  pNVar1->type = Expr;
  (pNVar1->values).
  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pNVar1->values).
  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pNVar1->values).
  super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pNVar1->field_1).expr = expr;
  pNVar1->origin = origin;
  return pNVar1;
}

Assistant:

static Node* makeExpr(Expression* expr, Expression* origin) {
    Node* ret = new Node(Expr);
    ret->expr = expr;
    ret->origin = origin;
    return ret;
  }